

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

bool __thiscall
deqp::gls::MultiVertexArrayTest::isUnalignedBufferStrideTest(MultiVertexArrayTest *this)

{
  pointer pAVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  
  pAVar1 = (this->m_spec).arrays.
           super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->m_spec).arrays.
                super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
  bVar6 = lVar2 != 0;
  if (bVar6) {
    uVar3 = lVar2 >> 6;
    uVar4 = 1;
    do {
      if (pAVar1->storage == STORAGE_BUFFER) {
        iVar5 = 4;
        if ((pAVar1->inputType & ~INPUTTYPE_FIXED) != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
          iVar5 = Array::inputTypeSize::size[(int)pAVar1->inputType];
        }
        if (pAVar1->stride % iVar5 != 0) {
          return bVar6;
        }
      }
      bVar6 = uVar4 < uVar3;
      lVar2 = (-(ulong)(uVar3 == 0) - uVar3) + uVar4;
      uVar4 = uVar4 + 1;
      pAVar1 = pAVar1 + 1;
    } while (lVar2 != 0);
  }
  return bVar6;
}

Assistant:

bool MultiVertexArrayTest::isUnalignedBufferStrideTest (void) const
{
	// Buffer strides should be data type size aligned
	for (size_t i = 0; i < m_spec.arrays.size(); ++i)
	{
		if (m_spec.arrays[i].storage == Array::STORAGE_BUFFER)
		{
			const bool inputTypePacked = m_spec.arrays[i].inputType == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_spec.arrays[i].inputType == Array::INPUTTYPE_INT_2_10_10_10;

			int dataTypeSize = Array::inputTypeSize(m_spec.arrays[i].inputType);
			if (inputTypePacked)
				dataTypeSize = 4;

			if (m_spec.arrays[i].stride % dataTypeSize != 0)
				return true;
		}
	}

	return false;
}